

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_rbtree.c
# Opt level: O2

void ngx_rbtree_delete(ngx_rbtree_t *tree,ngx_rbtree_node_t *node)

{
  u_char uVar1;
  ngx_rbtree_node_t *sentinel;
  ngx_rbtree_node_t *pnVar2;
  ngx_rbtree_node_t *pnVar3;
  ngx_rbtree_node_t *pnVar4;
  ngx_rbtree_t *pnVar5;
  ngx_rbtree_node_t *pnVar6;
  
  sentinel = tree->sentinel;
  pnVar2 = node->right;
  pnVar3 = node;
  pnVar4 = pnVar2;
  if ((node->left != sentinel) && (pnVar4 = node->left, pnVar2 != sentinel)) {
    do {
      pnVar3 = pnVar2;
      pnVar2 = pnVar3->left;
    } while (pnVar3->left != sentinel);
    pnVar4 = pnVar3->right;
  }
  if (pnVar3 == tree->root) {
    tree->root = pnVar4;
    pnVar4->color = '\0';
    node->right = (ngx_rbtree_node_t *)0x0;
    node->parent = (ngx_rbtree_node_t *)0x0;
    node->key = 0;
    node->left = (ngx_rbtree_node_t *)0x0;
    return;
  }
  pnVar2 = pnVar3->parent;
  uVar1 = pnVar3->color;
  (&pnVar2->left)[pnVar3 != pnVar2->left] = pnVar4;
  pnVar6 = pnVar4;
  if (pnVar3 != node) {
    if (pnVar2 == node) {
      pnVar2 = pnVar3;
    }
    pnVar4->parent = pnVar2;
    pnVar3->left = node->left;
    pnVar3->right = node->right;
    pnVar2 = node->parent;
    pnVar3->parent = pnVar2;
    pnVar3->color = node->color;
    pnVar5 = tree;
    if (tree->root != node) {
      pnVar5 = (ngx_rbtree_t *)&pnVar2->right;
      if (pnVar2->left == node) {
        pnVar5 = (ngx_rbtree_t *)&pnVar2->left;
      }
    }
    pnVar5->root = pnVar3;
    if (pnVar3->left != sentinel) {
      pnVar3->left->parent = pnVar3;
    }
    pnVar2 = pnVar3;
    pnVar6 = pnVar3->right;
    if (pnVar3->right == sentinel) goto LAB_0011cc2f;
  }
  pnVar6->parent = pnVar2;
LAB_0011cc2f:
  node->right = (ngx_rbtree_node_t *)0x0;
  node->parent = (ngx_rbtree_node_t *)0x0;
  node->key = 0;
  node->left = (ngx_rbtree_node_t *)0x0;
  if (uVar1 == '\0') {
    while ((pnVar4 != tree->root && (pnVar4->color == '\0'))) {
      pnVar5 = (ngx_rbtree_t *)&pnVar4->parent;
      pnVar2 = pnVar4->parent;
      pnVar3 = pnVar2->left;
      if (pnVar4 == pnVar3) {
        pnVar3 = pnVar2->right;
        if (pnVar3->color != '\0') {
          pnVar3->color = '\0';
          pnVar2->color = '\x01';
          ngx_rbtree_left_rotate(&tree->root,sentinel,pnVar2);
          pnVar2 = *(ngx_rbtree_node_t **)pnVar5;
          pnVar3 = pnVar2->right;
        }
        pnVar4 = pnVar3->right;
        if (pnVar3->left->color == '\0') {
          if (pnVar4->color == '\0') goto LAB_0011cd6f;
        }
        else if (pnVar4->color == '\0') {
          pnVar3->left->color = '\0';
          pnVar3->color = '\x01';
          ngx_rbtree_right_rotate(&tree->root,sentinel,pnVar3);
          pnVar2 = *(ngx_rbtree_node_t **)pnVar5;
          pnVar3 = pnVar2->right;
          pnVar4 = pnVar3->right;
        }
        pnVar3->color = pnVar2->color;
        pnVar2->color = '\0';
        pnVar4->color = '\0';
        ngx_rbtree_left_rotate(&tree->root,sentinel,pnVar2);
        pnVar5 = tree;
      }
      else {
        if (pnVar3->color != '\0') {
          pnVar3->color = '\0';
          pnVar2->color = '\x01';
          ngx_rbtree_right_rotate(&tree->root,sentinel,pnVar2);
          pnVar2 = *(ngx_rbtree_node_t **)pnVar5;
          pnVar3 = pnVar2->left;
        }
        pnVar4 = pnVar3->left;
        if (pnVar4->color == '\0') {
          if (pnVar3->right->color == '\0') {
LAB_0011cd6f:
            pnVar3->color = '\x01';
            goto LAB_0011cd66;
          }
          pnVar3->right->color = '\0';
          pnVar3->color = '\x01';
          ngx_rbtree_left_rotate(&tree->root,sentinel,pnVar3);
          pnVar2 = *(ngx_rbtree_node_t **)pnVar5;
          pnVar3 = pnVar2->left;
          pnVar4 = pnVar3->left;
        }
        pnVar3->color = pnVar2->color;
        pnVar2->color = '\0';
        pnVar4->color = '\0';
        ngx_rbtree_right_rotate(&tree->root,sentinel,pnVar2);
        pnVar5 = tree;
      }
LAB_0011cd66:
      pnVar4 = pnVar5->root;
    }
    pnVar4->color = '\0';
  }
  return;
}

Assistant:

void
ngx_rbtree_delete(ngx_rbtree_t *tree, ngx_rbtree_node_t *node)
{
    ngx_uint_t           red;
    ngx_rbtree_node_t  **root, *sentinel, *subst, *temp, *w;

    /* a binary tree delete */

    root = &tree->root;
    sentinel = tree->sentinel;

    if (node->left == sentinel) {
        temp = node->right;
        subst = node;

    } else if (node->right == sentinel) {
        temp = node->left;
        subst = node;

    } else {
        subst = ngx_rbtree_min(node->right, sentinel);

        if (subst->left != sentinel) {
            temp = subst->left;
        } else {
            temp = subst->right;
        }
    }

    if (subst == *root) {
        *root = temp;
        ngx_rbt_black(temp);

        /* DEBUG stuff */
        node->left = NULL;
        node->right = NULL;
        node->parent = NULL;
        node->key = 0;

        return;
    }

    red = ngx_rbt_is_red(subst);

    if (subst == subst->parent->left) {
        subst->parent->left = temp;

    } else {
        subst->parent->right = temp;
    }

    if (subst == node) {

        temp->parent = subst->parent;

    } else {

        if (subst->parent == node) {
            temp->parent = subst;

        } else {
            temp->parent = subst->parent;
        }

        subst->left = node->left;
        subst->right = node->right;
        subst->parent = node->parent;
        ngx_rbt_copy_color(subst, node);

        if (node == *root) {
            *root = subst;

        } else {
            if (node == node->parent->left) {
                node->parent->left = subst;
            } else {
                node->parent->right = subst;
            }
        }

        if (subst->left != sentinel) {
            subst->left->parent = subst;
        }

        if (subst->right != sentinel) {
            subst->right->parent = subst;
        }
    }

    /* DEBUG stuff */
    node->left = NULL;
    node->right = NULL;
    node->parent = NULL;
    node->key = 0;

    if (red) {
        return;
    }

    /* a delete fixup */

    while (temp != *root && ngx_rbt_is_black(temp)) {

        if (temp == temp->parent->left) {
            w = temp->parent->right;

            if (ngx_rbt_is_red(w)) {
                ngx_rbt_black(w);
                ngx_rbt_red(temp->parent);
                ngx_rbtree_left_rotate(root, sentinel, temp->parent);
                w = temp->parent->right;
            }

            if (ngx_rbt_is_black(w->left) && ngx_rbt_is_black(w->right)) {
                ngx_rbt_red(w);
                temp = temp->parent;

            } else {
                if (ngx_rbt_is_black(w->right)) {
                    ngx_rbt_black(w->left);
                    ngx_rbt_red(w);
                    ngx_rbtree_right_rotate(root, sentinel, w);
                    w = temp->parent->right;
                }

                ngx_rbt_copy_color(w, temp->parent);
                ngx_rbt_black(temp->parent);
                ngx_rbt_black(w->right);
                ngx_rbtree_left_rotate(root, sentinel, temp->parent);
                temp = *root;
            }

        } else {
            w = temp->parent->left;

            if (ngx_rbt_is_red(w)) {
                ngx_rbt_black(w);
                ngx_rbt_red(temp->parent);
                ngx_rbtree_right_rotate(root, sentinel, temp->parent);
                w = temp->parent->left;
            }

            if (ngx_rbt_is_black(w->left) && ngx_rbt_is_black(w->right)) {
                ngx_rbt_red(w);
                temp = temp->parent;

            } else {
                if (ngx_rbt_is_black(w->left)) {
                    ngx_rbt_black(w->right);
                    ngx_rbt_red(w);
                    ngx_rbtree_left_rotate(root, sentinel, w);
                    w = temp->parent->left;
                }

                ngx_rbt_copy_color(w, temp->parent);
                ngx_rbt_black(temp->parent);
                ngx_rbt_black(w->left);
                ngx_rbtree_right_rotate(root, sentinel, temp->parent);
                temp = *root;
            }
        }
    }

    ngx_rbt_black(temp);
}